

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_maskg(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGLabel *l;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  TCGTemp *ts_02;
  TCGv_i64 pTVar1;
  
  s = ctx->uc->tcg_ctx;
  l = gen_new_label_ppc64(s);
  ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  pTVar1 = (TCGv_i64)((long)ts - (long)s);
  ts_00 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  ts_01 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  ts_02 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  tcg_gen_op2_ppc64(s,INDEX_op_movi_i64,(TCGArg)ts_02,0xffffffff);
  tcg_gen_andi_i64_ppc64
            (s,pTVar1,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8)),0x1f);
  tcg_gen_andi_i64_ppc64
            (s,(TCGv_i64)((long)ts_00 - (long)s),
             *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),0x1f);
  tcg_gen_addi_i64_ppc64(s,(TCGv_i64)((long)ts_01 - (long)s),pTVar1,1);
  tcg_gen_op3_ppc64(s,INDEX_op_shr_i64,(TCGArg)ts_01,(TCGArg)ts_02,(TCGArg)ts_01);
  tcg_gen_op3_ppc64(s,INDEX_op_shr_i64,(TCGArg)ts_02,(TCGArg)ts_02,(TCGArg)ts_00);
  tcg_gen_op3_ppc64(s,INDEX_op_xor_i64,
                    (TCGArg)((long)&s->pool_cur +
                            (long)cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f]),(TCGArg)ts_01
                    ,(TCGArg)ts_02);
  tcg_gen_brcond_i64_ppc64(s,TCG_COND_GE,pTVar1,(TCGv_i64)((long)ts_00 - (long)s),l);
  pTVar1 = (TCGv_i64)
           ((long)&s->pool_cur + (long)cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f]);
  tcg_gen_op2_ppc64(s,INDEX_op_neg_i64,(TCGArg)pTVar1,(TCGArg)pTVar1);
  *(byte *)l = *(byte *)l | 1;
  tcg_gen_op1_ppc64(s,INDEX_op_set_label,(TCGArg)l);
  tcg_temp_free_internal_ppc64(s,ts);
  tcg_temp_free_internal_ppc64(s,ts_00);
  tcg_temp_free_internal_ppc64(s,ts_01);
  tcg_temp_free_internal_ppc64(s,ts_02);
  if ((ctx->opcode & 1) != 0) {
    gen_maskg_cold_1();
  }
  return;
}

Assistant:

static void gen_maskg(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGLabel *l1 = gen_new_label(tcg_ctx);
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);
    TCGv t2 = tcg_temp_new(tcg_ctx);
    TCGv t3 = tcg_temp_new(tcg_ctx);
    tcg_gen_movi_tl(tcg_ctx, t3, 0xFFFFFFFF);
    tcg_gen_andi_tl(tcg_ctx, t0, cpu_gpr[rB(ctx->opcode)], 0x1F);
    tcg_gen_andi_tl(tcg_ctx, t1, cpu_gpr[rS(ctx->opcode)], 0x1F);
    tcg_gen_addi_tl(tcg_ctx, t2, t0, 1);
    tcg_gen_shr_tl(tcg_ctx, t2, t3, t2);
    tcg_gen_shr_tl(tcg_ctx, t3, t3, t1);
    tcg_gen_xor_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], t2, t3);
    tcg_gen_brcond_tl(tcg_ctx, TCG_COND_GE, t0, t1, l1);
    tcg_gen_neg_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], cpu_gpr[rA(ctx->opcode)]);
    gen_set_label(tcg_ctx, l1);
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, t2);
    tcg_temp_free(tcg_ctx, t3);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rA(ctx->opcode)]);
    }
}